

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdb.c
# Opt level: O2

void sysbvm_gdb_registerObjectFile
               (sysbvm_gdb_jit_code_entry_t *entry,void *objectFileAddress,size_t objectFileSize)

{
  sysbvm_gdb_jit_code_entry_t *psVar1;
  
  entry->prev_entry = (sysbvm_gdb_jit_code_entry_s *)0x0;
  entry->symfile_addr = (char *)objectFileAddress;
  entry->symfile_size = objectFileSize;
  psVar1 = __jit_debug_descriptor.first_entry;
  entry->next_entry = __jit_debug_descriptor.first_entry;
  if (psVar1 != (sysbvm_gdb_jit_code_entry_t *)0x0) {
    entry->next_entry = psVar1->prev_entry;
  }
  __jit_debug_descriptor.action_flag = 1;
  __jit_debug_descriptor.relevant_entry = entry;
  __jit_debug_register_code();
  return;
}

Assistant:

SYSBVM_API void sysbvm_gdb_registerObjectFile(sysbvm_gdb_jit_code_entry_t *entry, const void *objectFileAddress, size_t objectFileSize)
{
    memset(entry, 0, sizeof(sysbvm_gdb_jit_code_entry_t ));
    entry->symfile_addr = (char*)objectFileAddress;
    entry->symfile_size = objectFileSize;

    entry->next_entry = __jit_debug_descriptor.first_entry;
    if(entry->next_entry)
        entry->next_entry = entry->next_entry->prev_entry;
    __jit_debug_descriptor.relevant_entry = entry;
    __jit_debug_descriptor.action_flag = SYSBVM_GDB_JIT_REGISTER_FN;
    __jit_debug_register_code();
}